

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O1

Ssw_Cla_t * Ssw_ClassesPrepareFromReprs(Aig_Man_t *pAig)

{
  void **ppvVar1;
  Aig_Obj_t **ppAVar2;
  int *piVar3;
  int iVar4;
  Ssw_Cla_t *pSVar5;
  Aig_Obj_t **ppAVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  Aig_Obj_t *pAVar10;
  int iVar11;
  Vec_Ptr_t *pVVar12;
  Aig_Obj_t *pAVar13;
  
  pSVar5 = Ssw_ClassesStart(pAig);
  pVVar12 = pAig->vObjs;
  ppAVar6 = (Aig_Obj_t **)calloc((long)pVVar12->nSize,8);
  pSVar5->pMemClasses = ppAVar6;
  pSVar5->nCands1 = 0;
  iVar4 = pVVar12->nSize;
  if (0 < iVar4) {
    ppvVar1 = pVVar12->pArray;
    lVar8 = 0;
    do {
      pvVar7 = ppvVar1[lVar8];
      if (pvVar7 != (void *)0x0) {
        ppAVar2 = pAig->pReprs;
        if (ppAVar2 == (Aig_Obj_t **)0x0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = ppAVar2[*(int *)((long)pvVar7 + 0x24)];
        }
        if (pAVar10 == pAig->pConst1) {
          pSVar5->nCands1 = pSVar5->nCands1 + 1;
        }
        else {
          if (ppAVar2 == (Aig_Obj_t **)0x0) {
            pAVar10 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar10 = ppAVar2[*(int *)((long)pvVar7 + 0x24)];
          }
          if (pAVar10 != (Aig_Obj_t *)0x0) {
            piVar3 = pSVar5->pClassSizes;
            iVar4 = piVar3[pAVar10->Id];
            piVar3[pAVar10->Id] = iVar4 + 1;
            if (iVar4 == 0) {
              piVar3[pAVar10->Id] = piVar3[pAVar10->Id] + 1;
            }
          }
        }
      }
      lVar8 = lVar8 + 1;
      iVar4 = pVVar12->nSize;
    } while (lVar8 < iVar4);
  }
  pSVar5->nClasses = 0;
  pvVar7 = calloc((long)iVar4,4);
  pVVar12 = pAig->vObjs;
  iVar4 = pVVar12->nSize;
  if (iVar4 < 1) {
    iVar11 = 0;
  }
  else {
    lVar8 = 0;
    iVar11 = 0;
    do {
      pAVar10 = (Aig_Obj_t *)pVVar12->pArray[lVar8];
      if (pAVar10 != (Aig_Obj_t *)0x0) {
        iVar4 = pSVar5->pClassSizes[lVar8];
        if (iVar4 == 0) {
          ppAVar2 = pAig->pReprs;
          if (ppAVar2 == (Aig_Obj_t **)0x0) {
            pAVar13 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar13 = ppAVar2[pAVar10->Id];
          }
          if (pAVar13 != pAig->pConst1) {
            if (ppAVar2 == (Aig_Obj_t **)0x0) {
              pAVar13 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar13 = ppAVar2[pAVar10->Id];
            }
            if (pAVar13 != (Aig_Obj_t *)0x0) {
              lVar9 = (long)pAVar13->Id;
              ppAVar2 = pSVar5->pId2Class[lVar9];
              iVar4 = *(int *)((long)pvVar7 + lVar9 * 4);
              *(int *)((long)pvVar7 + lVar9 * 4) = iVar4 + 1;
              ppAVar2[iVar4] = pAVar10;
            }
          }
        }
        else {
          lVar9 = (long)iVar11;
          pSVar5->pId2Class[lVar8] = ppAVar6 + lVar9;
          iVar11 = iVar4 + iVar11;
          iVar4 = *(int *)((long)pvVar7 + lVar8 * 4);
          *(int *)((long)pvVar7 + lVar8 * 4) = iVar4 + 1;
          (ppAVar6 + lVar9)[iVar4] = pAVar10;
          pSVar5->nClasses = pSVar5->nClasses + 1;
        }
      }
      lVar8 = lVar8 + 1;
      pVVar12 = pAig->vObjs;
      iVar4 = pVVar12->nSize;
    } while (lVar8 < iVar4);
  }
  pSVar5->pMemClassesFree = ppAVar6 + iVar11;
  pSVar5->nLits = iVar11 - pSVar5->nClasses;
  iVar4 = bcmp(pvVar7,pSVar5->pClassSizes,(long)iVar4 << 2);
  if (iVar4 != 0) {
    __assert_fail("memcmp(pClassSizes, p->pClassSizes, sizeof(int)*Aig_ManObjNumMax(pAig)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswClass.c"
                  ,0x32d,"Ssw_Cla_t *Ssw_ClassesPrepareFromReprs(Aig_Man_t *)");
  }
  if (pvVar7 != (void *)0x0) {
    free(pvVar7);
  }
  return pSVar5;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepareFromReprs( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    Aig_Obj_t * pObj, * pRepr;
    int * pClassSizes, nEntries, i;
    // start the classes
    p = Ssw_ClassesStart( pAig );
    // allocate memory for classes
    p->pMemClasses = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    // count classes
    p->nCands1 = 0;
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( Ssw_ObjIsConst1Cand(pAig, pObj) )
        {
            p->nCands1++;
            continue;
        }
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) )
        {
            if ( p->pClassSizes[pRepr->Id]++ == 0 )
                p->pClassSizes[pRepr->Id]++;
        }
    }
    // add nodes
    nEntries = 0;
    p->nClasses = 0;
    pClassSizes = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( p->pClassSizes[i] )
        {
            p->pId2Class[i] = p->pMemClasses + nEntries;
            nEntries += p->pClassSizes[i];
            p->pId2Class[i][pClassSizes[i]++] = pObj;
            p->nClasses++;
            continue;
        }
        if ( Ssw_ObjIsConst1Cand(pAig, pObj) )
            continue;
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) )
            p->pId2Class[pRepr->Id][pClassSizes[pRepr->Id]++] = pObj;
    }
    p->pMemClassesFree = p->pMemClasses + nEntries;
    p->nLits = nEntries - p->nClasses;
    assert( memcmp(pClassSizes, p->pClassSizes, sizeof(int)*Aig_ManObjNumMax(pAig)) == 0 );
    ABC_FREE( pClassSizes );
//    Abc_Print( 1, "After converting:\n" );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}